

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadBasisSolver(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *p_solver,bool destroy)

{
  Verbosity VVar1;
  byte in_DL;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Verbosity old_verbosity;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffffc8;
  SPxOut *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  Verbosity local_18;
  byte local_11;
  SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  setOutstream(in_RDI,in_RSI->spxout);
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar1 = SPxOut::getVerbosity(in_RDI->spxout), 4 < (int)VVar1)) {
    local_18 = SPxOut::getVerbosity(in_RDI->spxout);
    local_1c = 5;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_1c);
    soplex::operator<<(in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    soplex::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_18);
  }
  if ((in_RDI->freeSlinSolver & 1U) != 0) {
    if (in_RDI->factor !=
        (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      (*in_RDI->factor->_vptr_SLinSolver[0x1c])();
    }
    in_RDI->factor =
         (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
  }
  in_RDI->factor = local_10;
  in_RDI->factorized = false;
  (*in_RDI->factor->_vptr_SLinSolver[2])();
  in_RDI->freeSlinSolver = (bool)(local_11 & 1);
  return;
}

Assistant:

void SPxBasisBase<R>::loadBasisSolver(SLinSolver<R>* p_solver, const bool destroy)
{
   assert(!freeSlinSolver || factor != nullptr);

   setOutstream(*p_solver->spxout);

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS03 loading of Solver invalidates factorization"
                 << std::endl;)

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   factor = p_solver;
   factorized = false;
   factor->clear();
   freeSlinSolver = destroy;
}